

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O0

void boost::algorithm::trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_classifiedF *IsSpace)

{
  type this;
  undefined8 in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  is_classifiedF *in_stack_ffffffffffffff70;
  undefined8 local_58;
  is_classifiedF *in_stack_ffffffffffffffb8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  undefined8 local_18;
  
  range_adl_barrier::begin<std::__cxx11::string>(in_stack_ffffffffffffff68);
  range_adl_barrier::end<std::__cxx11::string>(in_stack_ffffffffffffff68);
  detail::is_classifiedF::is_classifiedF
            (in_stack_ffffffffffffff70,(is_classifiedF *)in_stack_ffffffffffffff68);
  detail::
  trim_end<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::algorithm::detail::is_classifiedF>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff70,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff68);
  this = range_adl_barrier::end<std::__cxx11::string>(in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff68);
  std::__cxx11::string::erase(in_RDI,local_18,local_58);
  detail::is_classifiedF::~is_classifiedF((is_classifiedF *)0x2afbdd);
  return;
}

Assistant:

inline void trim_right_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase(
                ::boost::algorithm::detail::trim_end( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace ),
                ::boost::end(Input)
                );
        }